

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall caffe::PoolingParameter::Clear(PoolingParameter *this)

{
  uint uVar1;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((char)uVar1 != '\0') {
    this->kernel_w_ = 0;
    this->stride_h_ = 0;
    this->stride_w_ = 0;
    this->pad_h_ = 0;
    this->pool_ = 0;
    this->kernel_size_ = 0;
    this->pad_ = 0;
    this->kernel_h_ = 0;
  }
  if ((uVar1 & 0xf00) != 0) {
    this->global_pooling_ = false;
    this->pad_w_ = 0;
    this->engine_ = 0;
    this->stride_ = 1;
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  return;
}

Assistant:

void PoolingParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.PoolingParameter)
  if (_has_bits_[0 / 32] & 255u) {
    ::memset(&pool_, 0, reinterpret_cast<char*>(&pad_h_) -
      reinterpret_cast<char*>(&pool_) + sizeof(pad_h_));
  }
  if (_has_bits_[8 / 32] & 3840u) {
    ::memset(&pad_w_, 0, reinterpret_cast<char*>(&global_pooling_) -
      reinterpret_cast<char*>(&pad_w_) + sizeof(global_pooling_));
    stride_ = 1u;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}